

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::PythonParameter::MergePartialFromCodedStream(PythonParameter *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  char *field_name;
  UnknownFieldSet *unknown_fields;
  int iVar8;
  pointer data;
  char cVar9;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  
  this_00 = &this->param_str_;
  this_01 = &this->layer_;
  this_02 = &this->module_;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b15ba;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b15ba:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_003b1640_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->module_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_02->ptr_);
      iVar8 = 6;
      if (!bVar6) goto LAB_003b1790;
      data = (this_02->ptr_->_M_dataplus)._M_p;
      iVar8 = (int)this_02->ptr_->_M_string_length;
      field_name = "caffe.PythonParameter.module";
LAB_003b1789:
      google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,iVar8,PARSE,field_name);
      goto LAB_003b178e;
    case 2:
      if (cVar9 != '\x12') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if ((this->layer_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_01->ptr_);
      iVar8 = 6;
      if (bVar6) {
        data = (this_01->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_01->ptr_->_M_string_length;
        field_name = "caffe.PythonParameter.layer";
        goto LAB_003b1789;
      }
      goto LAB_003b1790;
    case 3:
      if (cVar9 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        if ((this->param_str_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        iVar8 = 6;
        if (bVar6) {
          data = (this_00->ptr_->_M_dataplus)._M_p;
          iVar8 = (int)this_00->ptr_->_M_string_length;
          field_name = "caffe.PythonParameter.param_str";
          goto LAB_003b1789;
        }
        goto LAB_003b1790;
      }
      break;
    case 4:
      if (cVar9 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar11._8_8_ = 1;
          pVar11.first = (long)(char)uVar2;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar8 = 6;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->share_in_parallel_ = pVar11.first != 0;
          goto LAB_003b178e;
        }
        goto LAB_003b1790;
      }
    }
switchD_003b1640_default:
    iVar8 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      iVar8 = 6;
      if (bVar6) {
LAB_003b178e:
        iVar8 = 0;
      }
    }
LAB_003b1790:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool PythonParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PythonParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string module = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_module()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->module().data(), this->module().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.module");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string layer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_layer()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->layer().data(), this->layer().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.layer");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string param_str = 3 [default = ""];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_param_str()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->param_str().data(), this->param_str().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.param_str");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool share_in_parallel = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_share_in_parallel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &share_in_parallel_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PythonParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PythonParameter)
  return false;
#undef DO_
}